

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *xn,xpath_allocator *alloc,byte once)

{
  bool bVar1;
  long lVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  
  lVar2 = *xn;
  if (lVar2 == 0 || xn[1] != 0) {
    if ((xn[1] != 0) && (*xn != 0)) {
      pxVar3 = (xml_node_struct *)*xn;
      while (pxVar3 != (xml_node_struct *)0x0) {
        pxVar4 = pxVar3->first_child;
        if (pxVar3->first_child == (xml_node_struct *)0x0) {
          while (pxVar4 = pxVar3->next_sibling, pxVar3->next_sibling == (xml_node_struct *)0x0) {
            pxVar3 = pxVar3->parent;
            if (pxVar3 == (xml_node_struct *)0x0) {
              return;
            }
          }
        }
        pxVar3 = pxVar4;
        bVar1 = step_push(this,ns,pxVar3,alloc);
        if ((bVar1 & once) == 1) {
          return;
        }
      }
    }
  }
  else {
    do {
      pxVar3 = *(xml_node_struct **)(lVar2 + 0x30);
      if (pxVar3 != (xml_node_struct *)0x0) {
        bVar1 = step_push(this,ns,pxVar3,alloc);
        do {
          if ((bVar1 & once) != 0) {
            return;
          }
          pxVar4 = pxVar3->first_child;
          if (pxVar4 == (xml_node_struct *)0x0) {
            while (pxVar4 = pxVar3->next_sibling, pxVar4 == (xml_node_struct *)0x0) {
              pxVar3 = pxVar3->parent;
              if (pxVar3 == (xml_node_struct *)0x0) {
                return;
              }
            }
          }
          bVar1 = step_push(this,ns,pxVar4,alloc);
          pxVar3 = pxVar4;
        } while( true );
      }
      lVar2 = *(long *)(lVar2 + 0x18);
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}